

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::IsPropertyUnscopable(Var instanceVar,PropertyId propertyId)

{
  ScriptContext *requestContext;
  BOOL BVar1;
  BOOL BVar2;
  RecyclableObject *instance;
  Var instance_00;
  DynamicObject *instance_01;
  Var local_30;
  Var value;
  
  instance = VarTo<Js::RecyclableObject>(instanceVar);
  requestContext =
       (((((instance->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  BVar2 = 0;
  instance_00 = GetProperty(instance,0x1c,requestContext,(PropertyValueInfo *)0x0);
  BVar1 = IsObject(instance_00);
  if (BVar1 != 0) {
    instance_01 = VarTo<Js::DynamicObject>(instance_00);
    local_30 = (Var)0x0;
    BVar2 = 0;
    BVar1 = GetProperty(&instance_01->super_RecyclableObject,propertyId,&local_30,requestContext,
                        (PropertyValueInfo *)0x0);
    if (BVar1 != 0) {
      BVar2 = JavascriptConversion::ToBoolean(local_30,requestContext);
    }
  }
  return BVar2;
}

Assistant:

BOOL JavascriptOperators::IsPropertyUnscopable(Var instanceVar, PropertyId propertyId)
    {
        RecyclableObject* instance = VarTo<RecyclableObject>(instanceVar);
        ScriptContext * scriptContext = instance->GetScriptContext();

        Var unscopables = JavascriptOperators::GetProperty(instance, PropertyIds::_symbolUnscopables, scriptContext);
        if (JavascriptOperators::IsObject(unscopables))
        {
            DynamicObject *unscopablesList = VarTo<DynamicObject>(unscopables);
            Var value = nullptr;
            //8.1.1.2.1.9.c If blocked is not undefined
            if (JavascriptOperators::GetProperty(unscopablesList, propertyId, &value, scriptContext))
            {
                return JavascriptConversion::ToBoolean(value, scriptContext);
            }
        }

        return false;
    }